

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLSSetMassUserData(ARKodeMem ark_mem,void *user_data)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = (*ark_mem->step_getmassmem)(ark_mem);
  if (pvVar1 == (void *)0x0) {
    iVar2 = -6;
    arkProcessError(ark_mem,-6,0xfe9,"arkLSSetMassUserData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,"Mass matrix solver memory is NULL.");
  }
  else {
    if (*(long *)((long)pvVar1 + 8) != 0) {
      *(void **)((long)pvVar1 + 0x20) = user_data;
    }
    *(void **)((long)pvVar1 + 0xc0) = user_data;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int arkLSSetMassUserData(ARKodeMem ark_mem, void* user_data)
{
  ARKLsMassMem arkls_mem;
  int retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARKLS_SUCCESS) { return (retval); }

  /* Set data for mass matrix */
  if (arkls_mem->mass != NULL) { arkls_mem->M_data = user_data; }

  /* Data for Mtimes is set in arkLSSetMassTimes */

  /* Set data for Preconditioner */
  arkls_mem->P_data = user_data;

  return (ARKLS_SUCCESS);
}